

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetProperty_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info,bool isInit)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  DictionaryPropertyDescriptor<int> *pDVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  byte bVar7;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  DynamicObject *local_50;
  PropertyValueInfo *local_48;
  DictionaryPropertyDescriptor<int> *local_40;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)value;
  local_48 = info;
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId,scriptContext);
  descriptor = (DictionaryPropertyDescriptor<int> *)this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_50 = instance;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00c3172a;
    *puVar6 = 0;
    instance = local_50;
  }
  pDVar2 = descriptor;
  local_60 = ScriptContext::GetPropertyName(scriptContext,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    (*(BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                       **)&pDVar2[1].Getter,&local_60,&local_40);
  if (!bVar3) {
    if (local_60->isNumeric == true) {
      uVar4 = PropertyRecord::GetNumericValue(local_60);
      BVar5 = (**(code **)(*(long *)descriptor + 0x168))
                        (descriptor,instance,uVar4,propertyRecord,flags);
      return BVar5;
    }
    BVar5 = AddProperty((DictionaryTypeHandlerBase<int> *)descriptor,instance,local_60,
                        propertyRecord,'\a',local_48,flags,
                        (flags & (PropertyOperation_ThrowIfNotExtensible|
                                 PropertyOperation_StrictMode)) != PropertyOperation_None,
                        SideEffects_Any);
    return BVar5;
  }
  bVar3 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(local_40);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    local_50 = instance;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x352,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar3) {
LAB_00c3172a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    instance = local_50;
  }
  bVar7 = local_40->Attributes;
  if ((bVar7 & 8) == 0) {
    if (((bVar7 & 4) == 0) && ((bVar7 & 0x10) == 0 || (local_40->flags & IsShadowed) != None)) {
      if ((flags & PropertyOperation_Force) == PropertyOperation_None) {
        JavascriptError::ThrowCantAssignIfStrictMode(flags,scriptContext);
      }
      if (local_48 == (PropertyValueInfo *)0x0) {
        return 0;
      }
      local_48->m_instance = &instance->super_RecyclableObject;
      local_48->m_propertyIndex = 0xffff;
      local_48->m_attributes = '\0';
      local_48->flags = InlineCacheNoFlags;
      return 0;
    }
    if (((local_40->flags & IsAccessor) >> 2 & isInit) != 1) goto LAB_00c316f4;
  }
  else {
    if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          ((DynamicTypeHandler *)descriptor,scriptContext,
                           (flags & (PropertyOperation_ThrowIfNotExtensible|
                                    PropertyOperation_StrictMode)) != PropertyOperation_None),
       !bVar3)) {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches(scriptContext,propertyId);
    bVar7 = 7;
    if ((local_40->Attributes & 0x10) != 0) {
      bVar7 = local_40->Attributes & 0xd0 | 7;
    }
    local_40->Attributes = bVar7;
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  DictionaryPropertyDescriptor<int>::ConvertToData(local_40);
LAB_00c316f4:
  SetPropertyWithDescriptor<false>
            ((DictionaryTypeHandlerBase<int> *)descriptor,instance,local_60,&local_40,propertyRecord
             ,flags,local_48);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, bool isInit)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
        bool isForce = (flags & PropertyOperation_Force) != 0;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return false;
                    }
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
                instance->SetHasNoEnumerableProperties(false);
                descriptor->ConvertToData();
            }
            else if (!allowLetConstGlobal && descriptor->HasNonLetConstGlobal() && !(descriptor->Attributes & PropertyWritable))
            {
                if (!isForce)
                {
                    JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
                }

                // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
                // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads.  This
                // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
                // the local cache (that would be illegal), but still populate the type's property cache.
                PropertyValueInfo::SetNoCache(info, instance);
                return false;
            }
            else if (isInit && descriptor->GetIsAccessor())
            {
                descriptor->ConvertToData();
            }
            SetPropertyWithDescriptor<allowLetConstGlobal>(instance, propertyRecord, &descriptor, value, flags, info);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }
        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, throwIfNotExtensible, SideEffects_Any);
        }